

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void SHA1Transform(uint32_t *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  
  uVar6 = *(uint *)buffer;
  uVar5 = *(uint *)(buffer + 4);
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  uVar16 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar7 = (uVar1 << 5 | uVar1 >> 0x1b) + uVar16 + state[4] + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
          0x5a827999;
  uVar9 = uVar2 << 0x1e | uVar2 >> 2;
  uVar22 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar18 = ((uVar9 ^ uVar3) & uVar1 ^ uVar3) + uVar22 + uVar4 + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar13 = uVar1 << 0x1e | uVar1 >> 2;
  uVar6 = *(uint *)(buffer + 8);
  uVar5 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = ((uVar9 ^ uVar13) & uVar7 ^ uVar9) + uVar5 + uVar3 + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar8 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = *(uint *)(buffer + 0xc);
  uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar9 + uVar10 + ((uVar8 ^ uVar13) & uVar18 ^ uVar13) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(buffer + 0x10);
  uVar7 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar14 = uVar13 + uVar7 + ((uVar19 ^ uVar8) & uVar23 ^ uVar8) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(buffer + 0x14);
  uVar9 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar13 = uVar8 + uVar9 + ((uVar24 ^ uVar19) & uVar18 ^ uVar19) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = *(uint *)(buffer + 0x18);
  uVar8 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = uVar19 + uVar8 + ((uVar18 ^ uVar24) & uVar14 ^ uVar24) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar6 = *(uint *)(buffer + 0x1c);
  uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar19 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar25 = uVar24 + uVar11 + ((uVar14 ^ uVar18) & uVar13 ^ uVar18) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(buffer + 0x20);
  uVar13 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar24 = uVar18 + uVar13 + ((uVar19 ^ uVar14) & uVar23 ^ uVar14) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar20 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(buffer + 0x24);
  uVar18 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar15 = uVar14 + uVar18 + ((uVar20 ^ uVar19) & uVar25 ^ uVar19) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar6 = *(uint *)(buffer + 0x28);
  uVar14 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar23 = uVar19 + uVar14 + ((uVar26 ^ uVar20) & uVar24 ^ uVar20) + 0x5a827999 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar6 = *(uint *)(buffer + 0x2c);
  uVar12 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar25 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar20 + uVar12 + ((uVar24 ^ uVar26) & uVar15 ^ uVar26) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar6 = *(uint *)(buffer + 0x30);
  uVar19 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar20 = uVar26 + uVar19 + ((uVar25 ^ uVar24) & uVar23 ^ uVar24) + 0x5a827999 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = *(uint *)(buffer + 0x34);
  uVar30 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar24 = uVar24 + uVar30 + ((uVar23 ^ uVar25) & uVar15 ^ uVar25) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar26 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar6 = *(uint *)(buffer + 0x38);
  uVar21 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar15 = uVar25 + uVar21 + ((uVar26 ^ uVar23) & uVar20 ^ uVar23) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = *(uint *)(buffer + 0x3c);
  uVar27 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar20 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar24 = uVar23 + uVar20 + ((uVar27 ^ uVar26) & uVar24 ^ uVar26) + 0x5a827999 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar6 = uVar13 ^ uVar30 ^ uVar16 ^ uVar5;
  uVar23 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar26 = uVar26 + uVar23 + ((uVar25 ^ uVar27) & uVar15 ^ uVar27) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = uVar18 ^ uVar21 ^ uVar22 ^ uVar10;
  uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar27 = uVar27 + uVar15 + ((uVar16 ^ uVar25) & uVar24 ^ uVar25) + 0x5a827999 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar6 = uVar14 ^ uVar20 ^ uVar5 ^ uVar7;
  uVar5 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar24 = uVar25 + uVar22 + ((uVar5 ^ uVar16) & uVar26 ^ uVar16) + 0x5a827999 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar6 = uVar10 ^ uVar9 ^ uVar12 ^ uVar23;
  uVar25 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar10 = uVar16 + uVar25 + ((uVar26 ^ uVar5) & uVar27 ^ uVar5) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar28 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar6 = uVar7 ^ uVar8 ^ uVar19 ^ uVar15;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar5 = uVar5 + uVar6 + (uVar28 ^ uVar26 ^ uVar24) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b)
  ;
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar7 = uVar9 ^ uVar11 ^ uVar30 ^ uVar22;
  uVar16 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar26 = uVar26 + uVar16 + (uVar24 ^ uVar28 ^ uVar10) + 0x6ed9eba1 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar9 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar7 = uVar8 ^ uVar13 ^ uVar21 ^ uVar25;
  uVar27 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar28 = uVar28 + uVar27 + (uVar9 ^ uVar24 ^ uVar5) + 0x6ed9eba1 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar7 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar11 ^ uVar18 ^ uVar20 ^ uVar6;
  uVar11 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar10 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar8 = uVar24 + uVar11 + (uVar7 ^ uVar9 ^ uVar26) + 0x6ed9eba1 + (uVar28 * 0x20 | uVar28 >> 0x1b)
  ;
  uVar5 = uVar13 ^ uVar14 ^ uVar23 ^ uVar16;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar24 = uVar9 + uVar5 + (uVar10 ^ uVar7 ^ uVar28) + 0x6ed9eba1 + (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar9 = uVar18 ^ uVar12 ^ uVar15 ^ uVar27;
  uVar26 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar7 + uVar26 + (uVar29 ^ uVar10 ^ uVar8) + 0x6ed9eba1 + (uVar24 * 0x20 | uVar24 >> 0x1b)
  ;
  uVar13 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar14 ^ uVar19 ^ uVar22 ^ uVar11;
  uVar28 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar14 = uVar10 + uVar28 + (uVar13 ^ uVar29 ^ uVar24) + 0x6ed9eba1 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar18 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar7 = uVar12 ^ uVar30 ^ uVar25 ^ uVar5;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar8 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar24 = uVar29 + uVar7 + (uVar18 ^ uVar13 ^ uVar9) + 0x6ed9eba1 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar9 = uVar19 ^ uVar21 ^ uVar6 ^ uVar26;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar13 = uVar13 + uVar9 + (uVar8 ^ uVar18 ^ uVar14) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar12 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar14 = uVar30 ^ uVar20 ^ uVar16 ^ uVar28;
  uVar30 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar19 = uVar18 + uVar30 + (uVar12 ^ uVar8 ^ uVar24) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar29 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar18 = uVar21 ^ uVar23 ^ uVar27 ^ uVar7;
  uVar10 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar8 + uVar10 + (uVar29 ^ uVar12 ^ uVar13) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar8 = uVar20 ^ uVar15 ^ uVar11 ^ uVar9;
  uVar13 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar24 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar19 = uVar12 + uVar13 + (uVar14 ^ uVar29 ^ uVar19) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar8 = uVar23 ^ uVar22 ^ uVar5 ^ uVar30;
  uVar20 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar12 = uVar29 + uVar20 + (uVar24 ^ uVar14 ^ uVar18) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar8 = uVar15 ^ uVar25 ^ uVar26 ^ uVar10;
  uVar23 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar14 = uVar14 + uVar23 + (uVar18 ^ uVar24 ^ uVar19) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar15 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar8 = uVar22 ^ uVar6 ^ uVar28 ^ uVar13;
  uVar29 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar19 = uVar24 + uVar29 + (uVar15 ^ uVar18 ^ uVar12) + 0x6ed9eba1 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar22 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar8 = uVar25 ^ uVar16 ^ uVar7 ^ uVar20;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar24 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar18 = uVar18 + uVar8 + (uVar22 ^ uVar15 ^ uVar14) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar6 = uVar6 ^ uVar27 ^ uVar9 ^ uVar23;
  uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar15 = uVar15 + uVar21 + (uVar24 ^ uVar22 ^ uVar19) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar14 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar6 = uVar16 ^ uVar11 ^ uVar30 ^ uVar29;
  uVar12 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar22 + uVar12 + (uVar14 ^ uVar24 ^ uVar18) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = uVar27 ^ uVar5 ^ uVar10 ^ uVar8;
  uVar16 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar24 = uVar24 + uVar16 + (uVar19 ^ uVar14 ^ uVar15) + 0x6ed9eba1 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar25 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar6 = uVar11 ^ uVar26 ^ uVar13 ^ uVar21;
  uVar18 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar27 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar15 = uVar14 + uVar18 + (uVar25 ^ uVar19 ^ uVar22) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = uVar5 ^ uVar28 ^ uVar20 ^ uVar12;
  uVar14 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar19 + uVar14 + (uVar24 & uVar27 | (uVar24 | uVar27) & uVar25) + -0x70e44324 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar19 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar5 = uVar26 ^ uVar7 ^ uVar23 ^ uVar16;
  uVar11 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar25 = uVar25 + uVar11 + (uVar15 & uVar19 | (uVar15 | uVar19) & uVar27) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar24 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar5 = uVar28 ^ uVar9 ^ uVar29 ^ uVar18;
  uVar26 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar27 = uVar27 + uVar26 + (uVar6 & uVar24 | (uVar6 | uVar24) & uVar19) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar5 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = uVar7 ^ uVar30 ^ uVar8 ^ uVar14;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar19 = uVar19 + uVar6 + (uVar25 & uVar5 | (uVar25 | uVar5) & uVar24) + -0x70e44324 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar15 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar7 = uVar9 ^ uVar10 ^ uVar21 ^ uVar11;
  uVar22 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar24 = uVar24 + uVar22 + (uVar27 & uVar15 | (uVar27 | uVar15) & uVar5) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar27 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar7 = uVar30 ^ uVar13 ^ uVar12 ^ uVar26;
  uVar30 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar5 + uVar30 + (uVar19 & uVar27 | (uVar19 | uVar27) & uVar15) + -0x70e44324 +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar9 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = uVar10 ^ uVar20 ^ uVar16 ^ uVar6;
  uVar19 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar25 = uVar15 + uVar19 + (uVar24 & uVar9 | (uVar24 | uVar9) & uVar27) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar15 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar5 = uVar13 ^ uVar23 ^ uVar18 ^ uVar22;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar10 = uVar27 + uVar5 + (uVar7 & uVar15 | (uVar7 | uVar15) & uVar9) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar13 = uVar20 ^ uVar29 ^ uVar14 ^ uVar30;
  uVar20 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar13 = uVar9 + uVar20 + (uVar25 & uVar7 | (uVar25 | uVar7) & uVar15) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar9 = uVar23 ^ uVar8 ^ uVar11 ^ uVar19;
  uVar24 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar23 = uVar15 + uVar24 + (uVar10 & uVar25 | (uVar10 | uVar25) & uVar7) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar15 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar9 = uVar29 ^ uVar21 ^ uVar26 ^ uVar5;
  uVar28 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar7 + uVar28 + (uVar13 & uVar15 | (uVar13 | uVar15) & uVar25) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar7 = uVar8 ^ uVar12 ^ uVar6 ^ uVar20;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar10 = uVar25 + uVar7 + (uVar23 & uVar13 | (uVar23 | uVar13) & uVar15) + -0x70e44324 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar25 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar8 = uVar21 ^ uVar16 ^ uVar22 ^ uVar24;
  uVar21 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar27 = uVar15 + uVar21 + (uVar9 & uVar25 | (uVar9 | uVar25) & uVar13) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar23 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar12 ^ uVar18 ^ uVar30 ^ uVar28;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar15 = uVar13 + uVar9 + (uVar10 & uVar23 | (uVar10 | uVar23) & uVar25) + -0x70e44324 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar8 = uVar16 ^ uVar14 ^ uVar19 ^ uVar7;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar25 = uVar25 + uVar8 + (uVar27 & uVar10 | (uVar27 | uVar10) & uVar23) + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar16 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar13 = uVar18 ^ uVar11 ^ uVar5 ^ uVar21;
  uVar13 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar23 = uVar23 + uVar13 + (uVar15 & uVar16 | (uVar15 | uVar16) & uVar10) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar18 = uVar14 ^ uVar26 ^ uVar20 ^ uVar9;
  uVar18 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar12 = uVar10 + uVar18 + (uVar25 & uVar15 | (uVar25 | uVar15) & uVar16) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar14 = uVar11 ^ uVar6 ^ uVar24 ^ uVar8;
  uVar27 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar29 = uVar16 + uVar27 + (uVar23 & uVar25 | (uVar23 | uVar25) & uVar15) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar14 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar23 = uVar26 ^ uVar22 ^ uVar28 ^ uVar13;
  uVar10 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar23 = uVar15 + uVar10 + (uVar12 & uVar14 | (uVar12 | uVar14) & uVar25) + -0x70e44324 +
           (uVar29 * 0x20 | uVar29 >> 0x1b);
  uVar16 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar6 ^ uVar30 ^ uVar7 ^ uVar18;
  uVar11 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar25 + uVar11 + (uVar29 & uVar16 | (uVar29 | uVar16) & uVar14) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar26 = uVar29 * 0x40000000 | uVar29 >> 2;
  uVar15 = uVar22 ^ uVar19 ^ uVar21 ^ uVar27;
  uVar12 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar14 = uVar14 + uVar12 + (uVar26 ^ uVar16 ^ uVar23) + -0x359d3e2a +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar15 = uVar30 ^ uVar5 ^ uVar9 ^ uVar10;
  uVar30 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar25 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar16 = uVar16 + uVar30 + (uVar23 ^ uVar26 ^ uVar6) + -0x359d3e2a +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar6 = uVar19 ^ uVar20 ^ uVar8 ^ uVar11;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar26 + uVar6 + (uVar25 ^ uVar23 ^ uVar14) + -0x359d3e2a +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar19 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar5 = uVar5 ^ uVar24 ^ uVar13 ^ uVar12;
  uVar14 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar15 = uVar23 + uVar14 + (uVar19 ^ uVar25 ^ uVar16) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar5 = uVar20 ^ uVar28 ^ uVar18 ^ uVar30;
  uVar26 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar25 = uVar25 + uVar26 + (uVar16 ^ uVar19 ^ uVar22) + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar29 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar5 = uVar24 ^ uVar7 ^ uVar27 ^ uVar6;
  uVar23 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar24 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar5 = uVar19 + uVar23 + (uVar29 ^ uVar16 ^ uVar15) + -0x359d3e2a +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar19 = uVar28 ^ uVar21 ^ uVar10 ^ uVar14;
  uVar22 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar20 = uVar16 + uVar22 + (uVar24 ^ uVar29 ^ uVar25) + -0x359d3e2a +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar15 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar7 = uVar7 ^ uVar9 ^ uVar11 ^ uVar26;
  uVar25 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar28 = uVar29 + uVar25 + (uVar15 ^ uVar24 ^ uVar5) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = uVar21 ^ uVar8 ^ uVar12 ^ uVar23;
  uVar16 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar19 = uVar24 + uVar16 + (uVar5 ^ uVar15 ^ uVar20) + -0x359d3e2a +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar7 = uVar9 ^ uVar13 ^ uVar30 ^ uVar22;
  uVar20 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar24 = uVar15 + uVar20 + (uVar21 ^ uVar5 ^ uVar28) + -0x359d3e2a +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar7 = uVar8 ^ uVar18 ^ uVar6 ^ uVar25;
  uVar15 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar5 + uVar15 + (uVar29 ^ uVar21 ^ uVar19) + -0x359d3e2a +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar9 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = uVar13 ^ uVar27 ^ uVar14 ^ uVar16;
  uVar19 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar13 = uVar21 + uVar19 + (uVar9 ^ uVar29 ^ uVar24) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar8 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar5 = uVar18 ^ uVar10 ^ uVar26 ^ uVar20;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar28 = uVar29 + uVar5 + (uVar8 ^ uVar9 ^ uVar7) + -0x359d3e2a + (uVar13 * 0x20 | uVar13 >> 0x1b)
  ;
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar18 = uVar27 ^ uVar11 ^ uVar23 ^ uVar15;
  uVar24 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar9 = uVar9 + uVar24 + (uVar7 ^ uVar8 ^ uVar13) + -0x359d3e2a + (uVar28 * 0x20 | uVar28 >> 0x1b)
  ;
  uVar21 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar13 = uVar10 ^ uVar12 ^ uVar22 ^ uVar19;
  uVar18 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar13 = uVar8 + uVar18 + (uVar21 ^ uVar7 ^ uVar28) + -0x359d3e2a + (uVar9 * 0x20 | uVar9 >> 0x1b)
  ;
  uVar10 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar5 = uVar11 ^ uVar30 ^ uVar25 ^ uVar5;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar7 = uVar7 + uVar5 + (uVar10 ^ uVar21 ^ uVar9) + -0x359d3e2a + (uVar13 * 0x20 | uVar13 >> 0x1b)
  ;
  uVar24 = uVar12 ^ uVar6 ^ uVar16 ^ uVar24;
  uVar8 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar24 << 1 | (uint)((int)uVar24 < 0);
  uVar24 = uVar21 + uVar9 + (uVar8 ^ uVar10 ^ uVar13) + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar18 = uVar30 ^ uVar14 ^ uVar20 ^ uVar18;
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar18 = (uVar18 << 1 | (uint)((int)uVar18 < 0)) + uVar10 + (uVar13 ^ uVar8 ^ uVar7) + -0x359d3e2a
           + (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar5 = uVar26 ^ uVar6 ^ uVar15 ^ uVar5;
  uVar6 = uVar7 * 0x40000000 | uVar7 >> 2;
  iVar17 = (uVar5 << 1 | (uint)((int)uVar5 < 0)) + uVar8 + (uVar6 ^ uVar13 ^ uVar24) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar9 = uVar23 ^ uVar14 ^ uVar19 ^ uVar9;
  uVar7 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar5 = iVar17 + 0xca62c1d6;
  *state = (uVar9 << 1 | (uint)((int)uVar9 < 0)) + uVar1 + uVar13 + (uVar7 ^ uVar6 ^ uVar18) +
           -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b);
  state[1] = uVar2 + iVar17 + 0xca62c1d6;
  state[2] = (uVar18 * 0x40000000 | uVar18 >> 2) + uVar3;
  state[3] = uVar7 + uVar4;
  state[4] = uVar6 + state[4];
  return;
}

Assistant:

void SHA1Transform(
    uint32_t state[5],
    const unsigned char buffer[64]
)
{
    uint32_t a, b, c, d, e;

    typedef union
    {
        unsigned char c[64];
        uint32_t l[16];
    } CHAR64LONG16;

#ifdef SHA1HANDSOFF
    CHAR64LONG16 block[1];      /* use array to appear as a pointer */

    memcpy(block, buffer, 64);
#else
    /* The following had better never be used because it causes the
     * pointer-to-const buffer to be cast into a pointer to non-const.
     * And the result is written through.  I threw a "const" in, hoping
     * this will cause a diagnostic.
     */
    CHAR64LONG16 *block = (const CHAR64LONG16 *) buffer;
#endif
    /* Copy context->state[] to working vars */
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    /* 4 rounds of 20 operations each. Loop unrolled. */
    R0(a, b, c, d, e, 0);
    R0(e, a, b, c, d, 1);
    R0(d, e, a, b, c, 2);
    R0(c, d, e, a, b, 3);
    R0(b, c, d, e, a, 4);
    R0(a, b, c, d, e, 5);
    R0(e, a, b, c, d, 6);
    R0(d, e, a, b, c, 7);
    R0(c, d, e, a, b, 8);
    R0(b, c, d, e, a, 9);
    R0(a, b, c, d, e, 10);
    R0(e, a, b, c, d, 11);
    R0(d, e, a, b, c, 12);
    R0(c, d, e, a, b, 13);
    R0(b, c, d, e, a, 14);
    R0(a, b, c, d, e, 15);
    R1(e, a, b, c, d, 16);
    R1(d, e, a, b, c, 17);
    R1(c, d, e, a, b, 18);
    R1(b, c, d, e, a, 19);
    R2(a, b, c, d, e, 20);
    R2(e, a, b, c, d, 21);
    R2(d, e, a, b, c, 22);
    R2(c, d, e, a, b, 23);
    R2(b, c, d, e, a, 24);
    R2(a, b, c, d, e, 25);
    R2(e, a, b, c, d, 26);
    R2(d, e, a, b, c, 27);
    R2(c, d, e, a, b, 28);
    R2(b, c, d, e, a, 29);
    R2(a, b, c, d, e, 30);
    R2(e, a, b, c, d, 31);
    R2(d, e, a, b, c, 32);
    R2(c, d, e, a, b, 33);
    R2(b, c, d, e, a, 34);
    R2(a, b, c, d, e, 35);
    R2(e, a, b, c, d, 36);
    R2(d, e, a, b, c, 37);
    R2(c, d, e, a, b, 38);
    R2(b, c, d, e, a, 39);
    R3(a, b, c, d, e, 40);
    R3(e, a, b, c, d, 41);
    R3(d, e, a, b, c, 42);
    R3(c, d, e, a, b, 43);
    R3(b, c, d, e, a, 44);
    R3(a, b, c, d, e, 45);
    R3(e, a, b, c, d, 46);
    R3(d, e, a, b, c, 47);
    R3(c, d, e, a, b, 48);
    R3(b, c, d, e, a, 49);
    R3(a, b, c, d, e, 50);
    R3(e, a, b, c, d, 51);
    R3(d, e, a, b, c, 52);
    R3(c, d, e, a, b, 53);
    R3(b, c, d, e, a, 54);
    R3(a, b, c, d, e, 55);
    R3(e, a, b, c, d, 56);
    R3(d, e, a, b, c, 57);
    R3(c, d, e, a, b, 58);
    R3(b, c, d, e, a, 59);
    R4(a, b, c, d, e, 60);
    R4(e, a, b, c, d, 61);
    R4(d, e, a, b, c, 62);
    R4(c, d, e, a, b, 63);
    R4(b, c, d, e, a, 64);
    R4(a, b, c, d, e, 65);
    R4(e, a, b, c, d, 66);
    R4(d, e, a, b, c, 67);
    R4(c, d, e, a, b, 68);
    R4(b, c, d, e, a, 69);
    R4(a, b, c, d, e, 70);
    R4(e, a, b, c, d, 71);
    R4(d, e, a, b, c, 72);
    R4(c, d, e, a, b, 73);
    R4(b, c, d, e, a, 74);
    R4(a, b, c, d, e, 75);
    R4(e, a, b, c, d, 76);
    R4(d, e, a, b, c, 77);
    R4(c, d, e, a, b, 78);
    R4(b, c, d, e, a, 79);
    /* Add the working vars back into context.state[] */
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    /* Wipe variables */
    a = b = c = d = e = 0;
#ifdef SHA1HANDSOFF
    memset(block, '\0', sizeof(block));
#endif
}